

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_hsub_s_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  float32 fVar2;
  float32 fVar3;
  float32 fVar4;
  float32 fVar5;
  undefined1 auVar6 [16];
  int iVar8;
  undefined1 auVar7 [16];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar12 [16];
  undefined1 auVar18 [16];
  
  pfVar1 = (env->active_fpu).fpr + wt;
  fVar2 = pfVar1->fs[0];
  fVar3 = pfVar1->fs[1];
  fVar4 = pfVar1->fs[2];
  fVar5 = pfVar1->fs[3];
  auVar6._4_4_ = fVar4;
  auVar6._0_4_ = fVar4;
  auVar6._8_4_ = fVar4;
  auVar6._12_4_ = fVar4;
  auVar7 = pshufhw(auVar6,auVar6,0x55);
  auVar13._4_4_ = fVar5;
  auVar13._0_4_ = fVar5;
  auVar13._8_4_ = fVar5;
  auVar13._12_4_ = fVar5;
  auVar14 = pshufhw(auVar13,auVar13,0x55);
  auVar15._4_4_ = fVar2;
  auVar15._0_4_ = fVar2;
  auVar15._8_4_ = fVar2;
  auVar15._12_4_ = fVar2;
  auVar16 = pshufhw(auVar15,auVar15,0x55);
  auVar19._4_4_ = fVar3;
  auVar19._0_4_ = fVar3;
  auVar19._8_4_ = fVar3;
  auVar19._12_4_ = fVar3;
  auVar10 = pshufhw(auVar19,auVar19,0x55);
  auVar6 = psraw((undefined1  [16])(env->active_fpu).fpr[ws],8);
  iVar8 = (int)((ulong)(auVar10._0_8_ << 0x38) >> 0x20);
  iVar9 = (int)((ulong)(auVar10._8_8_ << 0x38) >> 0x20);
  auVar11._0_4_ = iVar8 >> 0x18;
  auVar12._4_4_ = iVar9 >> 0x18;
  auVar12._0_4_ = auVar11._0_4_;
  auVar12._8_4_ = auVar12._4_4_;
  auVar12._12_4_ = iVar9 >> 0x1f;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._4_4_ = iVar8 >> 0x1f;
  iVar8 = (int)((ulong)(auVar16._0_8_ << 0x38) >> 0x20);
  iVar9 = (int)((ulong)(auVar16._8_8_ << 0x38) >> 0x20);
  auVar17._0_4_ = iVar8 >> 0x18;
  auVar18._4_4_ = iVar9 >> 0x18;
  auVar18._0_4_ = auVar17._0_4_;
  auVar18._8_4_ = auVar18._4_4_;
  auVar18._12_4_ = iVar9 >> 0x1f;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = iVar8 >> 0x1f;
  auVar19 = packssdw(auVar17,auVar11);
  iVar8 = (int)((ulong)(auVar14._0_8_ << 0x38) >> 0x20);
  iVar9 = (int)((ulong)(auVar14._8_8_ << 0x38) >> 0x20);
  auVar14._0_4_ = iVar8 >> 0x18;
  auVar16._4_4_ = iVar9 >> 0x18;
  auVar16._0_4_ = auVar14._0_4_;
  auVar16._8_4_ = auVar16._4_4_;
  auVar16._12_4_ = iVar9 >> 0x1f;
  auVar14._8_8_ = auVar16._8_8_;
  auVar14._4_4_ = iVar8 >> 0x1f;
  iVar8 = (int)((ulong)(auVar7._0_8_ << 0x38) >> 0x20);
  iVar9 = (int)((ulong)(auVar7._8_8_ << 0x38) >> 0x20);
  auVar7._0_4_ = iVar8 >> 0x18;
  auVar10._4_4_ = iVar9 >> 0x18;
  auVar10._0_4_ = auVar7._0_4_;
  auVar10._8_4_ = auVar10._4_4_;
  auVar10._12_4_ = iVar9 >> 0x1f;
  auVar7._8_8_ = auVar10._8_8_;
  auVar7._4_4_ = iVar8 >> 0x1f;
  auVar7 = packssdw(auVar7,auVar14);
  auVar7 = packssdw(auVar19,auVar7);
  pfVar1 = (env->active_fpu).fpr + wd;
  *(short *)pfVar1 = auVar6._0_2_ - auVar7._0_2_;
  *(short *)((long)pfVar1 + 2) = auVar6._2_2_ - auVar7._2_2_;
  *(short *)((long)pfVar1 + 4) = auVar6._4_2_ - auVar7._4_2_;
  *(short *)((long)pfVar1 + 6) = auVar6._6_2_ - auVar7._6_2_;
  *(short *)((long)pfVar1 + 8) = auVar6._8_2_ - auVar7._8_2_;
  *(short *)((long)pfVar1 + 10) = auVar6._10_2_ - auVar7._10_2_;
  *(short *)((long)pfVar1 + 0xc) = auVar6._12_2_ - auVar7._12_2_;
  *(short *)((long)pfVar1 + 0xe) = auVar6._14_2_ - auVar7._14_2_;
  return;
}

Assistant:

void helper_msa_hsub_s_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_hsub_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_hsub_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_hsub_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_hsub_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_hsub_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_hsub_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_hsub_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_hsub_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}